

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-haproxy.c
# Opt level: O3

void cf_haproxy_close(Curl_cfilter *cf,Curl_easy *data)

{
  undefined4 *puVar1;
  Curl_cfilter *pCVar2;
  
  if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
      ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"close");
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  puVar1 = (undefined4 *)cf->ctx;
  *puVar1 = 0;
  Curl_dyn_reset((dynbuf *)(puVar1 + 2));
  pCVar2 = cf->next;
  if (pCVar2 != (Curl_cfilter *)0x0) {
    (*(code *)pCVar2->cft->do_close)(pCVar2,data);
    return;
  }
  return;
}

Assistant:

static void cf_haproxy_close(struct Curl_cfilter *cf,
                             struct Curl_easy *data)
{
  CURL_TRC_CF(data, cf, "close");
  cf->connected = FALSE;
  cf_haproxy_ctx_reset(cf->ctx);
  if(cf->next)
    cf->next->cft->do_close(cf->next, data);
}